

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O1

int Cortex_SendHtr(sHierarchy *pHierarchy,tSegmentData *pFrame)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  int iVar3;
  
  iVar1 = PackHierarchy(pHierarchy,Cortex_SendHtr::BigArray + 8,in_EDX);
  iVar3 = pHierarchy->nSegments * 0x38;
  iVar2 = iVar3 + 4;
  memcpy(Cortex_SendHtr::BigArray + (long)iVar1 + 8,pFrame,(long)iVar2);
  Cortex_SendHtr::BigArray[0] = '\x11';
  Cortex_SendHtr::BigArray[1] = '\0';
  Cortex_SendHtr::BigArray._4_2_ = (undefined2)iVar1;
  Cortex_SendHtr::BigArray._2_2_ = Cortex_SendHtr::BigArray._4_2_ + (short)iVar3 + 8;
  Cortex_SendHtr::BigArray._6_2_ = (undefined2)iVar2;
  iVar1 = SendToCortex((sPacket *)Cortex_SendHtr::BigArray);
  return (uint)(iVar1 != 0) * 3;
}

Assistant:

int Cortex_SendHtr(sHierarchy *pHierarchy, tSegmentData *pFrame)
{
  static char BigArray[0x20000];
  unsigned short *Header = &((unsigned short *) BigArray)[0];
  char *Ptr = &BigArray[8];
  int nBytesHierarchy = 0;
  int nBytesFrame = 0;

  // Packet ID        - 2 bytes
  // Packet DataSize  - 2 bytes
  // nBytesHierachy   - 2 bytes
  // nBytesDataFrame  - 2 bytes

#if 1
  Ptr = &BigArray[8];
  nBytesHierarchy = PackHierarchy(pHierarchy, Ptr, 0x20000);
  Ptr += nBytesHierarchy;
#endif

  nBytesFrame = sizeof(int) + pHierarchy->nSegments * 7 * sizeof(double);
  memcpy(Ptr, pFrame, nBytesFrame);

  Header[0] = PKT2_PUSH_BASEPOSITION;
  Header[1] = 4 + nBytesHierarchy + nBytesFrame;
  Header[2] = nBytesHierarchy;
  Header[3] = nBytesFrame;

  if (SendToCortex((sPacket *) BigArray) != 0) {
    return RC_NetworkError;
  }

  return 0;
}